

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O3

void __thiscall UnifiedRegex::RuntimeCharTrie::Print(RuntimeCharTrie *this,DebugWriter *w)

{
  long lVar1;
  long lVar2;
  
  DebugWriter::Indent(w);
  if (0 < this->count) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      DebugWriter::PrintQuotedChar(w,*(Char *)((long)this->children + lVar2 + -8));
      DebugWriter::EOL(w);
      Print((RuntimeCharTrie *)((long)&this->children->c + lVar2),w);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar1 < this->count);
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void RuntimeCharTrie::Print(DebugWriter* w) const
    {
        w->Indent();
        for (int i = 0; i < count; i++)
        {
            w->PrintQuotedChar(children[i].c);
            w->EOL();
            children[i].node.Print(w);
        }
        w->Unindent();
    }